

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_service_server
          (t_netstd_generator *this,ostream *out,t_service *tservice)

{
  bool bVar1;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_service *ptVar2;
  ostream *poVar3;
  ulong uVar4;
  string *psVar5;
  reference pptVar6;
  string local_700;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_6e0;
  t_function **local_6d8;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210 [8];
  string raw_func_name;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  allocator local_99;
  string local_98 [8];
  string extends_processor;
  allocator local_61;
  undefined1 local_60 [8];
  string extends;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)((long)&extends.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,"",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  ptVar2 = t_service::get_extends(tservice);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends(tservice);
    type_name_abi_cxx11_(&local_c0,this,&ptVar2->super_t_type,true);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   ".AsyncProcessor, ");
    std::__cxx11::string::operator=(local_98,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  prepare_member_name_mapping(this,tservice);
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_100);
  poVar3 = std::operator<<(poVar3,"public class AsyncProcessor : ");
  poVar3 = std::operator<<(poVar3,local_98);
  poVar3 = std::operator<<(poVar3,"ITAsyncProcessor");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_120);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_140);
  poVar3 = std::operator<<(poVar3,"private readonly IAsync _iAsync;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_160);
  poVar3 = std::operator<<(poVar3,"private readonly ILogger<AsyncProcessor> _logger;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_180);
  std::operator<<(poVar3,
                  "public AsyncProcessor(IAsync iAsync, ILogger<AsyncProcessor> logger = default)");
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator<<(out," : base(iAsync)");
  }
  poVar3 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1a0);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a0);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3,
                           "_iAsync = iAsync ?? throw new ArgumentNullException(nameof(iAsync));");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c0);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"_logger = logger;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  extends.field_2._8_8_ =
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  while( true ) {
    raw_func_name.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&extends.field_2 + 8),
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&raw_func_name.field_2 + 8));
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string(local_210,(string *)psVar5);
    t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_230);
    poVar3 = std::operator<<(poVar3,"processMap_[\"");
    poVar3 = std::operator<<(poVar3,local_210);
    poVar3 = std::operator<<(poVar3,"\"] = ");
    poVar3 = std::operator<<(poVar3,local_210);
    poVar3 = std::operator<<(poVar3,"_ProcessAsync;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string(local_210);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&extends.field_2 + 8));
  }
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_250);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_250);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_270);
    poVar3 = std::operator<<(poVar3,
                             "protected delegate global::System.Threading.Tasks.Task ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken "
                            );
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_270);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_290);
    poVar3 = std::operator<<(poVar3,
                             "protected Dictionary<string, ProcessFunction> processMap_ = new Dictionary<string, ProcessFunction>();"
                            );
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_350);
    poVar3 = std::operator<<(poVar3,
                             "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)"
                            );
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_370,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_370);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_390);
    poVar3 = std::operator<<(poVar3,
                             "return await ProcessAsync(iprot, oprot, CancellationToken.None);");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_390);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_3b0);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3b0);
    t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_3d0);
    poVar3 = std::operator<<(poVar3,
                             "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken "
                            );
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3d0);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_2b0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_2b0);
    poVar3 = std::operator<<(poVar3,
                             "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)"
                            );
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_2d0);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_2f0);
    poVar3 = std::operator<<(poVar3,
                             "return await ProcessAsync(iprot, oprot, CancellationToken.None);");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2f0);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_310);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_310);
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_330);
    poVar3 = std::operator<<(poVar3,
                             "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken "
                            );
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
  }
  t_generator::indent_abi_cxx11_(&local_3f0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_3f0);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3f0);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_410,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_410);
  poVar3 = std::operator<<(poVar3,"try");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_430,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_430);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_450,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_450);
  poVar3 = std::operator<<(poVar3,"var msg = await iprot.ReadMessageBeginAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_470,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_470);
  poVar3 = std::operator<<(poVar3,"processMap_.TryGetValue(msg.Name, out ProcessFunction fn);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_490,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_490);
  poVar3 = std::operator<<(poVar3,"if (fn == null)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4b0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_4b0);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_4d0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_4d0);
  poVar3 = std::operator<<(poVar3,"await TProtocolUtil.SkipAsync(iprot, TType.Struct, ");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_4f0);
  poVar3 = std::operator<<(poVar3,"await iprot.ReadMessageEndAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_510);
  poVar3 = std::operator<<(poVar3,
                           "var x = new TApplicationException (TApplicationException.ExceptionType.UnknownMethod, \"Invalid method name: \'\" + msg.Name + \"\'\");"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_530);
  poVar3 = std::operator<<(poVar3,
                           "await oprot.WriteMessageBeginAsync(new TMessage(msg.Name, TMessageType.Exception, msg.SeqID), "
                          );
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_550);
  poVar3 = std::operator<<(poVar3,"await x.WriteAsync(oprot, ");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_570,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_570);
  poVar3 = std::operator<<(poVar3,"await oprot.WriteMessageEndAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_590,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_590);
  poVar3 = std::operator<<(poVar3,"await oprot.Transport.FlushAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5b0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_5b0);
  poVar3 = std::operator<<(poVar3,"return true;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_5d0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_5d0);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_5f0);
  poVar3 = std::operator<<(poVar3,"await fn(msg.SeqID, iprot, oprot, ");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_610);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_610);
  t_generator::indent_abi_cxx11_(&local_630,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_630);
  poVar3 = std::operator<<(poVar3,"catch (IOException)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_650,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_650);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_670,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_670);
  poVar3 = std::operator<<(poVar3,"return false;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_670);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_690,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_690);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_6b0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_6b0);
  poVar3 = std::operator<<(poVar3,"return true;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_6d0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_6d0);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_6d0);
  local_6d8 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  extends.field_2._8_8_ = local_6d8;
  while( true ) {
    local_6e0._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&extends.field_2 + 8),&local_6e0);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    generate_process_function_async(this,out,tservice,*pptVar6);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&extends.field_2 + 8));
  }
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_700,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_700);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_700);
  cleanup_member_name_mapping(this,tservice);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)local_60);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_netstd_generator::generate_service_server(ostream& out, t_service* tservice)
{
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;

    string extends = "";
    string extends_processor = "";
    if (tservice->get_extends() != nullptr)
    {
        extends = type_name(tservice->get_extends());
        extends_processor = extends + ".AsyncProcessor, ";
    }

    prepare_member_name_mapping(tservice);
    out << indent() << "public class AsyncProcessor : " << extends_processor << "ITAsyncProcessor" << endl
        << indent() << "{" << endl;

    indent_up();

    out << indent() << "private readonly IAsync _iAsync;" << endl
        << indent() << "private readonly ILogger<AsyncProcessor> _logger;" << endl
        << endl
        << indent() << "public AsyncProcessor(IAsync iAsync, ILogger<AsyncProcessor> logger = default)";

    if (!extends.empty())
    {
        out << " : base(iAsync)";
    }

    out << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "_iAsync = iAsync ?? throw new ArgumentNullException(nameof(iAsync));" << endl;
    out << indent() << "_logger = logger;" << endl;
    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        string raw_func_name = (*f_iter)->get_name();
        out << indent() << "processMap_[\"" << raw_func_name << "\"] = " << raw_func_name << "_ProcessAsync;" << endl;
    }

    indent_down();
    out << indent() << "}" << endl
        << endl;

    if (extends.empty())
    {
        out << indent() << "protected delegate global::System.Threading.Tasks.Task ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    if (extends.empty())
    {
        out << indent() << "protected Dictionary<string, ProcessFunction> processMap_ = new Dictionary<string, ProcessFunction>();" << endl;
    }

    out << endl;

    if (extends.empty())
    {
        out << indent() << "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)" << endl
            << indent() << "{" << endl;
        indent_up();
        out << indent() << "return await ProcessAsync(iprot, oprot, CancellationToken.None);" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;

        out << indent() << "public async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl;
    }
    else
    {
        out << indent() << "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot)" << endl
            << indent() << "{" << endl;
        indent_up();
        out << indent() << "return await ProcessAsync(iprot, oprot, CancellationToken.None);" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;

        out << indent() << "public new async Task<bool> ProcessAsync(TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl;
    }

    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "var msg = await iprot.ReadMessageBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << endl
        << indent() << "processMap_.TryGetValue(msg.Name, out ProcessFunction fn);" << endl
        << endl
        << indent() << "if (fn == null)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "await TProtocolUtil.SkipAsync(iprot, TType.Struct, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await iprot.ReadMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "var x = new TApplicationException (TApplicationException.ExceptionType.UnknownMethod, \"Invalid method name: '\" + msg.Name + \"'\");" << endl
        << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(msg.Name, TMessageType.Exception, msg.SeqID), " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await x.WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.Transport.FlushAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "return true;" << endl;
    indent_down();
    out << indent() << "}" << endl
        << endl
        << indent() << "await fn(msg.SeqID, iprot, oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << endl;
    indent_down();
    out << indent() << "}" << endl;
    out << indent() << "catch (IOException)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "return false;" << endl;
    indent_down();
    out << indent() << "}" << endl
        << endl
        << indent() << "return true;" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        generate_process_function_async(out, tservice, *f_iter);
    }

    indent_down();
    out << indent() << "}" << endl << endl;
    cleanup_member_name_mapping(tservice);
}